

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::Ifc2DCompositeCurve::~Ifc2DCompositeCurve
          (Ifc2DCompositeCurve *this,void **vtt)

{
  void **vtt_local;
  Ifc2DCompositeCurve *this_local;
  
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::Ifc2DCompositeCurve,_0UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::Ifc2DCompositeCurve,_0UL> *)
             &(this->super_IfcCompositeCurve).field_0x78,vtt + 0x1f);
  IfcCompositeCurve::~IfcCompositeCurve(&this->super_IfcCompositeCurve,vtt + 1);
  return;
}

Assistant:

Ifc2DCompositeCurve() : Object("Ifc2DCompositeCurve") {}